

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O2

yajl_gen_status yajl_gen_array_close(yajl_gen g)

{
  yajl_gen_state yVar1;
  yajl_print_t p_Var2;
  void *pvVar3;
  char *__s;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  uint _i;
  yajl_gen_status yVar7;
  uint uVar8;
  
  if (g->state[g->depth] == yajl_gen_error) {
    yVar7 = yajl_gen_in_error_state;
  }
  else {
    if (g->state[g->depth] != yajl_gen_complete) {
      uVar4 = g->depth - 1;
      g->depth = uVar4;
      if (uVar4 < 0x80) {
        if ((g->flags & 1) != 0) {
          (*g->print)(g->ctx,"\n",1);
          uVar4 = g->depth;
        }
        yVar1 = g->state[uVar4];
        uVar6 = (ulong)yVar1;
        if (4 >= uVar6) {
          g->state[uVar4] = *(yajl_gen_state *)(&DAT_00107848 + uVar6 * 4);
        }
        if (((g->flags & 1) != 0) && (4 < uVar6 || 1 < yVar1 - yajl_gen_map_start)) {
          for (uVar8 = 0; uVar8 < uVar4; uVar8 = uVar8 + 1) {
            p_Var2 = g->print;
            pvVar3 = g->ctx;
            __s = g->indentString;
            sVar5 = strlen(__s);
            (*p_Var2)(pvVar3,__s,sVar5 & 0xffffffff);
            uVar4 = g->depth;
          }
        }
        (*g->print)(g->ctx,"]",1);
        if ((g->flags & 1) == 0) {
          return yajl_gen_status_ok;
        }
        if (g->state[g->depth] != yajl_gen_complete) {
          return yajl_gen_status_ok;
        }
        (*g->print)(g->ctx,"\n",1);
        return yajl_gen_status_ok;
      }
    }
    yVar7 = yajl_gen_generation_complete;
  }
  return yVar7;
}

Assistant:

yajl_gen_status
yajl_gen_array_close(yajl_gen g)
{
    ENSURE_VALID_STATE;
    DECREMENT_DEPTH;
    if ((g->flags & yajl_gen_beautify)) g->print(g->ctx, "\n", 1);
    APPENDED_ATOM;
    INSERT_WHITESPACE;
    g->print(g->ctx, "]", 1);
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}